

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D_adapt.c
# Opt level: O2

int main(void)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  UserData udata;
  sunrealtype *psVar5;
  N_Vector flagvalue;
  FILE *__stream;
  FILE *__stream_00;
  void *flagvalue_00;
  void *flagvalue_01;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  sunrealtype sVar14;
  int flag;
  N_Vector local_c8;
  sunrealtype *local_c0;
  uint local_b4;
  SUNContext ctx;
  void *local_a8;
  void *local_a0;
  N_Vector local_98;
  sunrealtype newdt;
  sunrealtype olddt;
  sunrealtype t;
  long local_78;
  long local_70;
  sunindextype local_68;
  long nli;
  long nni;
  long local_50;
  void *local_48;
  sunindextype Nnew;
  void *local_38;
  
  flag = SUNContext_Create(0,&ctx);
  iVar3 = check_flag(&flag,"SUNContext_Create",1);
  if (iVar3 == 0) {
    udata = (UserData)malloc(0x20);
    udata->N = 0x15;
    udata->k = 0.5;
    udata->refine_tol = 0.003;
    psVar5 = (sunrealtype *)malloc(0xa8);
    udata->x = psVar5;
    for (lVar6 = 0; lVar6 != 0x15; lVar6 = lVar6 + 1) {
      psVar5[lVar6] = (double)lVar6 / 20.0;
    }
    puts("\n1D adaptive Heat PDE test problem:");
    printf("  diffusion coefficient:  k = %g\n",udata->k);
    printf("  initial N = %li\n",udata->N);
    flagvalue = (N_Vector)N_VNew_Serial(0x15,ctx);
    iVar3 = check_flag(flagvalue,"N_VNew_Serial",0);
    if (iVar3 == 0) {
      N_VConst(0,flagvalue);
      __stream = fopen("heat_mesh.txt","w");
      for (lVar6 = 0; lVar6 < udata->N; lVar6 = lVar6 + 1) {
        fprintf(__stream," %.16e",udata->x[lVar6]);
      }
      fputc(10,__stream);
      __stream_00 = fopen("heat1D.txt","w");
      local_c8 = flagvalue;
      lVar6 = N_VGetArrayPointer(flagvalue);
      for (lVar9 = 0; lVar9 < udata->N; lVar9 = lVar9 + 1) {
        fprintf(__stream_00," %.16e",*(undefined8 *)(lVar6 + lVar9 * 8));
      }
      fputc(10,__stream_00);
      flagvalue_00 = (void *)ARKStepCreate(0,0,f,local_c8,ctx);
      local_38 = flagvalue_00;
      iVar3 = check_flag(flagvalue_00,"ARKStepCreate",0);
      if (iVar3 == 0) {
        flag = ARKodeSetUserData(flagvalue_00,udata);
        iVar3 = check_flag(&flag,"ARKodeSetUserData",1);
        if (iVar3 == 0) {
          flag = ARKodeSetMaxNumSteps(flagvalue_00,10000);
          iVar3 = check_flag(&flag,"ARKodeSetMaxNumSteps",1);
          if (iVar3 == 0) {
            flag = ARKodeSStolerances(0x3f50624dd2f1a9fc,0x3ddb7cdfd9d7bdbb,flagvalue_00);
            iVar3 = check_flag(&flag,"ARKodeSStolerances",1);
            if (iVar3 == 0) {
              flag = ARKStepSetAdaptivityMethod(flagvalue_00,2,1,0,0);
              iVar3 = check_flag(&flag,"ARKodeSetAdaptivityMethod",1);
              if (iVar3 == 0) {
                flag = ARKodeSetPredictorMethod(flagvalue_00,0);
                iVar3 = check_flag(&flag,"ARKodeSetPredictorMethod",1);
                if (iVar3 == 0) {
                  flag = ARKodeSetLinear(flagvalue_00,1);
                  iVar3 = check_flag(&flag,"ARKodeSetLinear",1);
                  if (iVar3 == 0) {
                    flagvalue_01 = (void *)SUNLinSol_PCG(local_c8,0,0x15,ctx);
                    iVar3 = check_flag(flagvalue_01,"SUNLinSol_PCG",0);
                    if (iVar3 == 0) {
                      flag = ARKodeSetLinearSolver(flagvalue_00,flagvalue_01,0);
                      iVar3 = check_flag(&flag,"ARKodeSetLinearSolver",1);
                      if (iVar3 == 0) {
                        flag = ARKodeSetJacTimes(flagvalue_00,0,Jac);
                        iVar3 = check_flag(&flag,"ARKodeSetJacTimes",1);
                        if (iVar3 == 0) {
                          t = 0.0;
                          olddt = 0.0;
                          newdt = 0.0;
                          local_a0 = flagvalue_01;
                          puts(
                              "  iout          dt_old                 dt_new               ||u||_rms       N   NNI  NLI"
                              );
                          puts(
                              " ----------------------------------------------------------------------------------------"
                              );
                          local_c0 = (sunrealtype *)olddt;
                          local_a8 = (void *)newdt;
                          dVar11 = (double)N_VDotProd(local_c8,local_c8);
                          dVar11 = dVar11 / (double)udata->N;
                          if (dVar11 < 0.0) {
                            dVar11 = sqrt(dVar11);
                          }
                          else {
                            dVar11 = SQRT(dVar11);
                          }
                          local_70 = 0;
                          printf(" %4i  %19.15e  %19.15e  %19.15e  %li   %2i  %3i\n",local_c0,
                                 local_a8,dVar11,0,udata->N,0,0);
                          local_78 = 0;
                          local_b4 = 0;
                          do {
                            if (1.0 <= t) {
                              puts(
                                  " ----------------------------------------------------------------------------------------"
                                  );
                              puts(" Final solver statistics:");
                              printf("   Total number of time steps = %i\n",(ulong)local_b4);
                              printf("   Total nonlinear iterations = %li\n",local_70);
                              printf("   Total linear iterations    = %li\n\n",local_78);
                              fclose(__stream_00);
                              fclose(__stream);
                              N_VDestroy(local_c8);
                              free(udata->x);
                              free(udata);
                              ARKodeFree(&local_38);
                              SUNLinSolFree(local_a0);
                              SUNContext_Free(&ctx);
                              return 0;
                            }
                            flag = ARKodeSetStopTime(0x3ff0000000000000,flagvalue_00);
                            iVar3 = check_flag(&flag,"ARKodeSetStopTime",1);
                            if (iVar3 != 0) {
                              return 1;
                            }
                            flag = ARKodeEvolve(0x3ff0000000000000,flagvalue_00,local_c8,&t,2);
                            iVar3 = check_flag(&flag,"ARKodeEvolve",1);
                            if (iVar3 != 0) {
                              return 1;
                            }
                            flag = ARKodeGetLastStep(flagvalue_00,&olddt);
                            iVar3 = check_flag(&flag,"ARKodeGetLastStep",1);
                            if (iVar3 != 0) {
                              return 1;
                            }
                            flag = ARKodeGetCurrentStep(flagvalue_00,&newdt);
                            iVar3 = check_flag(&flag,"ARKodeGetCurrentStep",1);
                            if (iVar3 != 0) {
                              return 1;
                            }
                            flag = ARKodeGetNumNonlinSolvIters(flagvalue_00,&nni);
                            iVar3 = check_flag(&flag,"ARKodeGetNumNonlinSolvIters",1);
                            if (iVar3 != 0) {
                              return 1;
                            }
                            flag = ARKodeGetNumLinIters(flagvalue_00,&nli);
                            iVar3 = check_flag(&flag,"ARKodeGetNumLinIters",1);
                            if (iVar3 != 0) {
                              return 1;
                            }
                            local_c0 = (sunrealtype *)olddt;
                            local_a8 = (void *)newdt;
                            dVar11 = (double)N_VDotProd(local_c8,local_c8);
                            dVar11 = dVar11 / (double)udata->N;
                            if (dVar11 < 0.0) {
                              dVar11 = sqrt(dVar11);
                            }
                            else {
                              dVar11 = SQRT(dVar11);
                            }
                            local_b4 = local_b4 + 1;
                            printf(" %4i  %19.15e  %19.15e  %19.15e  %li   %2li  %3li\n",local_c0,
                                   local_a8,dVar11,(ulong)local_b4,udata->N,nni,nli);
                            lVar6 = nni;
                            local_50 = nli;
                            local_c0 = (sunrealtype *)N_VGetArrayPointer(local_c8);
                            for (lVar9 = 0; lVar9 < udata->N; lVar9 = lVar9 + 1) {
                              fprintf(__stream_00," %.16e",
                                      *(undefined8 *)((long)local_c0 + lVar9 * 8));
                            }
                            local_70 = local_70 + lVar6;
                            fputc(10,__stream_00);
                            for (lVar6 = 0; lVar6 < udata->N; lVar6 = lVar6 + 1) {
                              fprintf(__stream," %.16e",udata->x[lVar6]);
                            }
                            fputc(10,__stream);
                            psVar5 = adapt_mesh(local_c8,&Nnew,udata);
                            iVar3 = check_flag(psVar5,"ark_adapt",0);
                            if (iVar3 != 0) {
                              return 1;
                            }
                            local_68 = Nnew;
                            local_98 = (N_Vector)N_VNew_Serial(Nnew,ctx);
                            iVar3 = check_flag(local_98,"N_VNew_Serial",0);
                            if (iVar3 != 0) {
                              return 1;
                            }
                            lVar6 = udata->N;
                            local_c0 = udata->x;
                            local_a8 = (void *)N_VGetArrayPointer(local_c8);
                            iVar4 = check_flag(local_a8,"N_VGetArrayPointer",0);
                            iVar3 = 1;
                            if (iVar4 == 0) {
                              local_48 = (void *)N_VGetArrayPointer(local_98);
                              iVar4 = check_flag(local_48,"N_VGetArrayPointer",0);
                              iVar3 = 1;
                              if (iVar4 == 0) {
                                lVar6 = lVar6 + -1;
                                lVar9 = 0;
                                if (0 < local_68) {
                                  lVar9 = local_68;
                                }
                                lVar10 = 0;
                                for (lVar7 = 0; lVar7 != lVar9; lVar7 = lVar7 + 1) {
                                  dVar11 = psVar5[lVar7];
                                  lVar8 = lVar10;
                                  for (; lVar10 < lVar6; lVar10 = lVar10 + 1) {
                                    sVar14 = local_c0[lVar10];
                                    if ((sVar14 <= dVar11) && (dVar11 <= local_c0[lVar10 + 1]))
                                    goto LAB_00102b24;
                                    lVar8 = lVar6;
                                  }
                                  sVar14 = local_c0[lVar8];
                                  lVar10 = lVar8;
LAB_00102b24:
                                  pdVar1 = (double *)((long)local_a8 + lVar10 * 8);
                                  dVar2 = local_c0[lVar10 + 1];
                                  auVar12._0_8_ = (dVar11 - dVar2) * *pdVar1;
                                  auVar12._8_8_ = (dVar11 - sVar14) * pdVar1[1];
                                  auVar13._8_8_ = dVar2 - sVar14;
                                  auVar13._0_8_ = sVar14 - dVar2;
                                  auVar13 = divpd(auVar12,auVar13);
                                  *(double *)((long)local_48 + lVar7 * 8) =
                                       auVar13._8_8_ + auVar13._0_8_;
                                }
                                iVar3 = 0;
                              }
                            }
                            flag = iVar3;
                            iVar3 = check_flag(&flag,"project",1);
                            if (iVar3 != 0) {
                              return 1;
                            }
                            N_VDestroy(local_c8);
                            free(udata->x);
                            udata->x = psVar5;
                            udata->N = local_68;
                            flag = ARKodeResize(0x3ff0000000000000,t,flagvalue_00,local_98,0,0);
                            iVar3 = check_flag(&flag,"ARKodeResize",1);
                            if (iVar3 != 0) {
                              return 1;
                            }
                            SUNLinSolFree(local_a0);
                            local_a0 = (void *)SUNLinSol_PCG(local_98,0,0x15,ctx);
                            iVar3 = check_flag(local_a0,"SUNLinSol_PCG",0);
                            if (iVar3 != 0) {
                              return 1;
                            }
                            flag = ARKodeSetLinearSolver(flagvalue_00,local_a0,0);
                            iVar3 = check_flag(&flag,"ARKodeSetLinearSolver",1);
                            if (iVar3 != 0) {
                              return 1;
                            }
                            local_78 = local_78 + local_50;
                            flag = ARKodeSetJacTimes(flagvalue_00,0,Jac);
                            iVar3 = check_flag(&flag,"ARKodeSetJacTimes",1);
                            local_c8 = local_98;
                          } while (iVar3 == 0);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(1.0);    /* final time */
  sunrealtype rtol   = SUN_RCONST(1.e-3);  /* relative tolerance */
  sunrealtype atol   = SUN_RCONST(1.e-10); /* absolute tolerance */
  sunrealtype hscale = SUN_RCONST(1.0); /* time step change factor on resizes */
  UserData udata     = NULL;
  sunrealtype* data;
  sunindextype N     = 21;                 /* initial spatial mesh size */
  sunrealtype refine = SUN_RCONST(3.0e-3); /* adaptivity refinement tolerance */
  sunrealtype k      = SUN_RCONST(0.5);    /* heat conductivity */
  sunindextype i;
  long int nni, nni_tot = 0, nli, nli_tot = 0;
  int iout = 0;

  /* general problem variables */
  int flag;                  /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  N_Vector y2        = NULL; /* empty vector for storing solution */
  N_Vector yt        = NULL; /* empty vector for swapping */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  FILE *XFID, *UFID;
  sunrealtype t, olddt, newdt;
  sunrealtype* xnew = NULL;
  sunindextype Nnew;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* allocate and fill initial udata structure */
  udata             = (UserData)malloc(sizeof(*udata));
  udata->N          = N;
  udata->k          = k;
  udata->refine_tol = refine;
  udata->x          = malloc(N * sizeof(sunrealtype));
  for (i = 0; i < N; i++) { udata->x[i] = ONE * i / (N - 1); }

  /* Initial problem output */
  printf("\n1D adaptive Heat PDE test problem:\n");
  printf("  diffusion coefficient:  k = %" GSYM "\n", udata->k);
  printf("  initial N = %li\n", (long int)udata->N);

  /* Initialize data structures */
  y = N_VNew_Serial(N, ctx); /* Create initial serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(ZERO, y); /* Set initial conditions */

  /* output mesh to disk */
  XFID = fopen("heat_mesh.txt", "w");

  /* output initial mesh to disk */
  for (i = 0; i < udata->N; i++) { fprintf(XFID, " %.16" ESYM, udata->x[i]); }
  fprintf(XFID, "\n");

  /* Open output stream for results, access data array */
  UFID = fopen("heat1D.txt", "w");

  /* output initial condition to disk */
  data = N_VGetArrayPointer(y);
  for (i = 0; i < udata->N; i++) { fprintf(UFID, " %.16" ESYM, data[i]); }
  fprintf(UFID, "\n");

  /* Initialize the ARK timestepper */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)udata); /* Pass udata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }
  flag = ARKodeSetMaxNumSteps(arkode_mem, 10000); /* Increase max num steps  */
  if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, rtol, atol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }
  flag = ARKStepSetAdaptivityMethod(arkode_mem, 2, 1, 0,
                                    NULL); /* Set adaptivity method */
  if (check_flag(&flag, "ARKodeSetAdaptivityMethod", 1)) { return 1; }
  flag = ARKodeSetPredictorMethod(arkode_mem, 0); /* Set predictor method */
  if (check_flag(&flag, "ARKodeSetPredictorMethod", 1)) { return 1; }

  /* Specify linearly implicit RHS, with time-dependent Jacobian */
  flag = ARKodeSetLinear(arkode_mem, 1);
  if (check_flag(&flag, "ARKodeSetLinear", 1)) { return 1; }

  /* Initialize PCG solver -- no preconditioning, with up to N iterations  */
  LS = SUNLinSol_PCG(y, 0, (int)N, ctx);
  if (check_flag((void*)LS, "SUNLinSol_PCG", 0)) { return 1; }

  /* Linear solver interface -- set user-supplied J*v routine (no 'jtsetup' required) */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               NULL); /* Attach linear solver to ARKODE */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacTimes(arkode_mem, NULL, Jac); /* Set the Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacTimes", 1)) { return 1; }

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t     = T0;
  olddt = ZERO;
  newdt = ZERO;
  printf("  iout          dt_old                 dt_new               "
         "||u||_rms       N   NNI  NLI\n");
  printf(" --------------------------------------------------------------------"
         "--------------------\n");
  printf(" %4i  %19.15" ESYM "  %19.15" ESYM "  %19.15e  %li   %2i  %3i\n",
         iout, olddt, newdt, sqrt(N_VDotProd(y, y) / udata->N),
         (long int)udata->N, 0, 0);
  while (t < Tf)
  {
    /* "set" routines */
    flag = ARKodeSetStopTime(arkode_mem, Tf);
    if (check_flag(&flag, "ARKodeSetStopTime", 1)) { return 1; }

    /* call integrator */
    flag = ARKodeEvolve(arkode_mem, Tf, y, &t, ARK_ONE_STEP);
    if (check_flag(&flag, "ARKodeEvolve", 1)) { return 1; }

    /* "get" routines */
    flag = ARKodeGetLastStep(arkode_mem, &olddt);
    if (check_flag(&flag, "ARKodeGetLastStep", 1)) { return 1; }
    flag = ARKodeGetCurrentStep(arkode_mem, &newdt);
    if (check_flag(&flag, "ARKodeGetCurrentStep", 1)) { return 1; }
    flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
    if (check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1)) { return 1; }
    flag = ARKodeGetNumLinIters(arkode_mem, &nli);
    if (check_flag(&flag, "ARKodeGetNumLinIters", 1)) { return 1; }

    /* print current solution stats */
    iout++;
    printf(" %4i  %19.15" ESYM "  %19.15" ESYM "  %19.15e  %li   %2li  %3li\n",
           iout, olddt, newdt, sqrt(N_VDotProd(y, y) / udata->N),
           (long int)udata->N, nni, nli);
    nni_tot += nni;
    nli_tot += nli;

    /* output results and current mesh to disk */
    data = N_VGetArrayPointer(y);
    for (i = 0; i < udata->N; i++) { fprintf(UFID, " %.16" ESYM, data[i]); }
    fprintf(UFID, "\n");
    for (i = 0; i < udata->N; i++) { fprintf(XFID, " %.16" ESYM, udata->x[i]); }
    fprintf(XFID, "\n");

    /* adapt the spatial mesh */
    xnew = adapt_mesh(y, &Nnew, udata);
    if (check_flag(xnew, "ark_adapt", 0)) { return 1; }

    /* create N_Vector of new length */
    y2 = N_VNew_Serial(Nnew, ctx);
    if (check_flag((void*)y2, "N_VNew_Serial", 0)) { return 1; }

    /* project solution onto new mesh */
    flag = project(udata->N, udata->x, y, Nnew, xnew, y2);
    if (check_flag(&flag, "project", 1)) { return 1; }

    /* delete old vector, old mesh */
    N_VDestroy(y);
    free(udata->x);

    /* swap x and xnew so that new mesh is stored in udata structure */
    udata->x = xnew;
    xnew     = NULL;
    udata->N = Nnew; /* store size of new mesh */

    /* swap y and y2 so that y holds new solution */
    yt = y;
    y  = y2;
    y2 = yt;

    /* call ARKodeResize to notify integrator of change in mesh */
    flag = ARKodeResize(arkode_mem, y, hscale, t, NULL, NULL);
    if (check_flag(&flag, "ARKodeResize", 1)) { return 1; }

    /* destroy and re-allocate linear solver memory; reattach to ARKODE interface */
    SUNLinSolFree(LS);
    LS = SUNLinSol_PCG(y, 0, (int)N, ctx);
    if (check_flag((void*)LS, "SUNLinSol_PCG", 0)) { return 1; }
    flag = ARKodeSetLinearSolver(arkode_mem, LS, NULL);
    if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
    flag = ARKodeSetJacTimes(arkode_mem, NULL, Jac);
    if (check_flag(&flag, "ARKodeSetJacTimes", 1)) { return 1; }
  }
  printf(" --------------------------------------------------------------------"
         "--------------------\n");

  /* print some final statistics */
  printf(" Final solver statistics:\n");
  printf("   Total number of time steps = %i\n", iout);
  printf("   Total nonlinear iterations = %li\n", nni_tot);
  printf("   Total linear iterations    = %li\n\n", nli_tot);

  /* Clean up and return with successful completion */
  fclose(UFID);
  fclose(XFID);
  N_VDestroy(y);  /* Free vectors */
  free(udata->x); /* Free user data */
  free(udata);
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}